

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O2

void __thiscall
so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
stored<so_5::mchain_props::details::limited_dynamic_demand_queue>
          (deliver_op_tracer *this,limited_dynamic_demand_queue *queue)

{
  chain_size local_10;
  
  local_10.m_size =
       std::deque<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>::size
                 (&queue->m_queue);
  make_trace<so_5::impl::msg_tracing_helpers::details::chain_size>(this,"stored",&local_10);
  return;
}

Assistant:

void
				stored( const QUEUE & queue )
					{
						make_trace( "stored", details::chain_size{ queue.size() } );
					}